

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
wallet::coinselector_tests::NewWallet(NodeContext *m_node,string *wallet_name)

{
  long lVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  CWallet *in_RDX;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  CWallet *in_stack_00000038;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  assertion_result *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffed0;
  DBErrors in_stack_fffffffffffffed4;
  char *pszName;
  _Head_base<0UL,_wallet::CWallet_*,_false> this;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *__args_2;
  CWallet *in_stack_ffffffffffffff00;
  Chain **in_stack_ffffffffffffff08;
  const_string local_d0 [2];
  lazy_ostream local_b0 [2];
  assertion_result local_90 [2];
  pointer local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this._M_head_impl = in_RDI;
  local_50 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_fffffffffffffea8);
  __args_2 = (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             &stack0xffffffffffffffc8;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_fffffffffffffea8);
  CreateMockableWalletDatabase((MockableData *)in_stack_fffffffffffffeb8);
  std::
  make_unique<wallet::CWallet,interfaces::Chain*,std::__cxx11::string_const&,std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            (in_stack_ffffffffffffff08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff00,__args_2);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffffeb8);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_fffffffffffffea8);
  do {
    pszName = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8,
               (pointer)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (unsigned_long)in_stack_fffffffffffffea8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffea8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this._M_head_impl,(const_string *)in_RDI,(size_t)pszName,
               (const_string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_fffffffffffffea8);
    in_stack_fffffffffffffed4 = CWallet::LoadWallet(in_stack_ffffffffffffff00);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffeb8,(bool)in_stack_fffffffffffffeb7);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8,
               (pointer)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (unsigned_long)in_stack_fffffffffffffea8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffea8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8,
               (pointer)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (unsigned_long)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffea8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_90,local_b0,local_d0,0xb7,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffea8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffea8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffea8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this._M_head_impl,
             (AnnotatedMixin<std::recursive_mutex> *)in_RDI,pszName,
             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int)((ulong)plVar3 >> 0x20),SUB81((ulong)plVar3 >> 0x18,0));
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffea8);
  CWallet::SetWalletFlag(in_RDX,(uint64_t)this._M_head_impl);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffea8);
  CWallet::SetupDescriptorScriptPubKeyMans(in_stack_00000038);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
         (tuple<wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>)this._M_head_impl;
}

Assistant:

static std::unique_ptr<CWallet> NewWallet(const node::NodeContext& m_node, const std::string& wallet_name = "")
{
    std::unique_ptr<CWallet> wallet = std::make_unique<CWallet>(m_node.chain.get(), wallet_name, CreateMockableWalletDatabase());
    BOOST_CHECK(wallet->LoadWallet() == DBErrors::LOAD_OK);
    LOCK(wallet->cs_wallet);
    wallet->SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    wallet->SetupDescriptorScriptPubKeyMans();
    return wallet;
}